

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-keymap.c
# Opt level: O1

void keymap_dump(ang_file *fff)

{
  keymap *pkVar1;
  ulong uVar2;
  keypress key [2];
  char buf [1024];
  undefined1 local_458 [16];
  undefined8 local_448;
  char local_438 [1032];
  
  uVar2 = (ulong)(player->opts).opt[1];
  pkVar1 = keymaps[uVar2];
  if (pkVar1 != (keymap *)0x0) {
    do {
      local_458._0_4_ = EVT_NONE;
      local_458._4_4_ = 0;
      local_458._8_8_ = 0;
      local_448 = 0;
      if (pkVar1->user == true) {
        keypress_to_text(local_438,0x400,pkVar1->actions,false);
        file_putf(fff,"keymap-act:%s\n",local_438);
        local_458._0_4_ = (pkVar1->key).type;
        local_458._4_4_ = (pkVar1->key).code;
        local_458._8_4_ = *(undefined4 *)&(pkVar1->key).mods;
        keypress_to_text(local_438,0x400,(keypress *)local_458,true);
        file_putf(fff,"keymap-input:%d:%s\n",uVar2);
        file_putf(fff,"\n");
      }
      pkVar1 = pkVar1->next;
    } while (pkVar1 != (keymap *)0x0);
  }
  return;
}

Assistant:

void keymap_dump(ang_file *fff)
{
	int mode;
	struct keymap *k;

	if (OPT(player, rogue_like_commands))
		mode = KEYMAP_MODE_ROGUE;
	else
		mode = KEYMAP_MODE_ORIG;

	for (k = keymaps[mode]; k; k = k->next) {
		char buf[1024];
		struct keypress key[2] = { KEYPRESS_NULL, KEYPRESS_NULL };

		if (!k->user) continue;

		/* Encode the action */
		keypress_to_text(buf, sizeof(buf), k->actions, false);
		file_putf(fff, "keymap-act:%s\n", buf);

		/* Convert the key into a string */
		key[0] = k->key;
		keypress_to_text(buf, sizeof(buf), key, true);
		file_putf(fff, "keymap-input:%d:%s\n", mode, buf);

		file_putf(fff, "\n");
	}
}